

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O1

int issue_char(lws *wsi,uchar c)

{
  uint16_t *puVar1;
  uint uVar2;
  allocated_headers *paVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  iVar4 = lws_pos_in_bounds(wsi);
  iVar6 = -1;
  if (iVar4 == 0) {
    paVar3 = (wsi->http).ah;
    uVar2 = paVar3->current_token_limit;
    if ((uVar2 == 0) || (uVar5 = (uint)paVar3->frags[paVar3->nfrag].len, uVar5 < uVar2)) {
      uVar2 = paVar3->pos;
      paVar3->pos = uVar2 + 1;
      paVar3->data[uVar2] = c;
      paVar3 = (wsi->http).ah;
      puVar1 = &paVar3->frags[paVar3->nfrag].len;
      *puVar1 = *puVar1 + 1;
      iVar6 = 0;
    }
    else {
      if (uVar2 == uVar5) {
        iVar4 = lws_pos_in_bounds(wsi);
        if (iVar4 != 0) {
          return -1;
        }
        paVar3 = (wsi->http).ah;
        uVar2 = paVar3->pos;
        paVar3->pos = uVar2 + 1;
        paVar3->data[uVar2] = '\0';
        paVar3 = (wsi->http).ah;
        _lws_log(2,"header %li exceeds limit %ld\n",(ulong)paVar3->parser_state,
                 (ulong)paVar3->current_token_limit);
      }
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

static int LWS_WARN_UNUSED_RESULT
issue_char(struct lws *wsi, unsigned char c)
{
	unsigned short frag_len;

	if (lws_pos_in_bounds(wsi))
		return -1;

	frag_len = wsi->http.ah->frags[wsi->http.ah->nfrag].len;
	/*
	 * If we haven't hit the token limit, just copy the character into
	 * the header
	 */
	if (!wsi->http.ah->current_token_limit ||
	    frag_len < wsi->http.ah->current_token_limit) {
		wsi->http.ah->data[wsi->http.ah->pos++] = (char)c;
		wsi->http.ah->frags[wsi->http.ah->nfrag].len++;
		return 0;
	}

	/* Insert a null character when we *hit* the limit: */
	if (frag_len == wsi->http.ah->current_token_limit) {
		if (lws_pos_in_bounds(wsi))
			return -1;

		wsi->http.ah->data[wsi->http.ah->pos++] = '\0';
		lwsl_warn("header %li exceeds limit %ld\n",
			  (long)wsi->http.ah->parser_state,
			  (long)wsi->http.ah->current_token_limit);
	}

	return 1;
}